

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O3

void __thiscall embree::AccelN::accels_build(AccelN *this)

{
  pointer ppAVar1;
  Accel *pAVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  char cVar8;
  int iVar9;
  task *ptVar10;
  runtime_error *this_00;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  pointer ppAVar17;
  char *pcVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  task_group_context context;
  AccelN **local_e8;
  task_traits local_e0;
  AccelN *local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  wait_context local_c0;
  task_group_context local_b0;
  
  ppAVar17 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (ppAVar17 !=
      (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<embree::Accel_*,_std::allocator<embree::Accel_*>_>,_true>::
    _S_do_it(&this->accels);
    ppAVar17 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  ppAVar1 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_b0.my_version = proxy_support;
  local_b0.my_traits = (context_traits)0x4;
  local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b0.my_name = CUSTOM_CTX;
  local_d8 = this;
  tbb::detail::r1::initialize(&local_b0);
  local_e8 = &local_d8;
  if (ppAVar17 != ppAVar1) {
    local_e0.m_version_and_traits = 0;
    ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_e0,0xc0);
    ptVar10->m_reserved[3] = 0;
    ptVar10->m_reserved[4] = 0;
    ptVar10->m_reserved[1] = 0;
    ptVar10->m_reserved[2] = 0;
    (ptVar10->super_task_traits).m_version_and_traits = 0;
    ptVar10->m_reserved[0] = 0;
    ptVar10->m_reserved[5] = 0;
    ptVar10->_vptr_task = (_func_int **)&PTR__task_02184ae8;
    ptVar10[1]._vptr_task = (_func_int **)((long)ppAVar17 - (long)ppAVar1 >> 3);
    ptVar10[1].super_task_traits.m_version_and_traits = 0;
    ptVar10[1].m_reserved[0] = 1;
    ptVar10[1].m_reserved[1] = (uint64_t)&local_e8;
    ptVar10[1].m_reserved[2] = 0;
    ptVar10[1].m_reserved[3] = 1;
    iVar9 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar10[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
    ptVar10[1].m_reserved[5] = (long)iVar9 * 2 & 0x7ffffffffffffffe;
    ptVar10[2].super_task_traits.m_version_and_traits = local_e0.m_version_and_traits;
    local_d0 = 0;
    local_c8 = 1;
    local_c0.m_version_and_traits = 1;
    local_c0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar10[1].m_reserved[4] = (uint64_t)&local_d0;
    tbb::detail::r1::execute_and_wait(ptVar10,&local_b0,&local_c0,&local_b0);
  }
  cVar8 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
  if (cVar8 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_b0);
  ppAVar17 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)ppAVar1 - (long)ppAVar17 >> 3;
  if (ppAVar1 == ppAVar17) {
    pcVar13 = "AccelN::intersector8";
    pcVar16 = "AccelN::intersector4";
    pcVar14 = "AccelN::intersector1";
    pcVar12 = "AccelN::intersector16";
  }
  else {
    bVar6 = true;
    lVar15 = 0;
    bVar5 = true;
    bVar4 = true;
    bVar3 = true;
    do {
      pAVar2 = ppAVar17[lVar15];
      bVar3 = (bool)(bVar3 & *(long *)&pAVar2->field_0x90 != 0);
      bVar4 = (bool)(bVar4 & *(long *)&pAVar2->field_0xa8 != 0);
      bVar5 = (bool)(bVar5 & *(long *)&pAVar2->field_0xf0 != 0);
      bVar6 = (bool)(bVar6 & *(long *)&pAVar2->field_0x138 != 0);
      lVar15 = lVar15 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar15);
    pcVar18 = (char *)0x0;
    pcVar14 = "AccelN::intersector1";
    if (!bVar3) {
      pcVar14 = pcVar18;
    }
    pcVar16 = "AccelN::intersector4";
    if (!bVar4) {
      pcVar16 = pcVar18;
    }
    pcVar13 = "AccelN::intersector8";
    if (!bVar5) {
      pcVar13 = pcVar18;
    }
    pcVar12 = "AccelN::intersector16";
    if (!bVar6) {
      pcVar12 = pcVar18;
    }
  }
  if ((long)ppAVar1 - (long)ppAVar17 == 8) {
    (this->super_Accel).super_AccelData.type = ((*ppAVar17)->super_AccelData).type;
    pAVar2 = *ppAVar17;
    uVar7 = *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 =
         *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.lower.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 + 8) =
         uVar7;
    uVar7 = *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 =
         *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds0.upper.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 + 8) =
         uVar7;
    uVar7 = *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 =
         *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.lower.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 + 8) =
         uVar7;
    uVar7 = *(undefined8 *)((long)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0 + 8);
    *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 =
         *(undefined8 *)&(pAVar2->super_AccelData).bounds.bounds1.upper.field_0;
    *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 + 8) =
         uVar7;
    memcpy(&(this->super_Accel).super_AccelData.field_0x58,
           &((*ppAVar17)->super_AccelData).field_0x58,0x118);
  }
  else {
    (this->super_Accel).super_AccelData.type = TY_ACCELN;
    *(AccelN **)&(this->super_Accel).super_AccelData.field_0x58 = this;
    *(code **)&(this->super_Accel).field_0x78 = intersect;
    *(code **)&(this->super_Accel).field_0x80 = occluded;
    *(code **)&(this->super_Accel).field_0x88 = pointQuery;
    *(char **)&(this->super_Accel).field_0x90 = pcVar14;
    *(code **)&(this->super_Accel).field_0x98 = intersect4;
    *(code **)&(this->super_Accel).field_0xa0 = occluded4;
    *(char **)&(this->super_Accel).field_0xa8 = pcVar16;
    *(code **)&(this->super_Accel).field_0xe0 = intersect8;
    *(code **)&(this->super_Accel).field_0xe8 = occluded8;
    *(char **)&(this->super_Accel).field_0xf0 = pcVar13;
    *(code **)&(this->super_Accel).field_0x128 = intersect16;
    *(code **)&(this->super_Accel).field_0x130 = occluded16;
    *(char **)&(this->super_Accel).field_0x138 = pcVar12;
    aVar19 = _DAT_01f7a9f0;
    (this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 = _DAT_01f7a9f0;
    aVar20 = _DAT_01f7aa00;
    (this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 = _DAT_01f7aa00;
    (this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 = aVar19;
    (this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 = aVar20;
    if (ppAVar1 != ppAVar17) {
      lVar15 = 0;
      aVar21 = aVar19;
      aVar22 = aVar20;
      do {
        pAVar2 = ppAVar17[lVar15];
        aVar19.m128 = (__m128)minps(aVar19.m128,
                                    (pAVar2->super_AccelData).bounds.bounds0.lower.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 = aVar19;
        aVar20.m128 = (__m128)maxps(aVar20.m128,
                                    (pAVar2->super_AccelData).bounds.bounds0.upper.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 = aVar20;
        aVar21.m128 = (__m128)minps(aVar21.m128,
                                    (pAVar2->super_AccelData).bounds.bounds1.lower.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 = aVar21;
        aVar22.m128 = (__m128)maxps(aVar22.m128,
                                    (pAVar2->super_AccelData).bounds.bounds1.upper.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 = aVar22;
        lVar15 = lVar15 + 1;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar15);
    }
  }
  return;
}

Assistant:

void AccelN::accels_build () 
  {
    /* reduce memory consumption */
    accels.shrink_to_fit();
    
    /* build all acceleration structures in parallel */
    parallel_for (accels.size(), [&] (size_t i) { 
        accels[i]->build();
      });

    /* create list of non-empty acceleration structures */
    bool valid1 = true;
    bool valid4 = true;
    bool valid8 = true;
    bool valid16 = true;
    for (size_t i=0; i<accels.size(); i++) {
      valid1 &= (bool) accels[i]->intersectors.intersector1;
      valid4 &= (bool) accels[i]->intersectors.intersector4;
      valid8 &= (bool) accels[i]->intersectors.intersector8;
      valid16 &= (bool) accels[i]->intersectors.intersector16;
    }

    if (accels.size() == 1) {
      type = accels[0]->type; // FIXME: should just assign entire Accel
      bounds = accels[0]->bounds;
      intersectors = accels[0]->intersectors;
    }
    else 
    {
      type = AccelData::TY_ACCELN;
      intersectors.ptr = this;
      intersectors.intersector1  = Intersector1(&intersect,&occluded,&pointQuery,valid1 ? "AccelN::intersector1": nullptr);
      intersectors.intersector4  = Intersector4(&intersect4,&occluded4,valid4 ? "AccelN::intersector4" : nullptr);
      intersectors.intersector8  = Intersector8(&intersect8,&occluded8,valid8 ? "AccelN::intersector8" : nullptr);
      intersectors.intersector16 = Intersector16(&intersect16,&occluded16,valid16 ? "AccelN::intersector16": nullptr);

      /*! calculate bounds */
      bounds = empty;
      for (size_t i=0; i<accels.size(); i++) 
        bounds.extend(accels[i]->bounds);
    }
  }